

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdumpPrepass::OnImportGlobal
          (BinaryReaderObjdumpPrepass *this,Index import_index,string_view module_name,
          string_view field_name,Index global_index,Type type,bool mutable_)

{
  string_view local_d8 [2];
  string_view local_b8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [32];
  string_view local_58;
  undefined1 local_45;
  Index local_44;
  bool mutable__local;
  BinaryReaderObjdumpPrepass *pBStack_40;
  Index import_index_local;
  BinaryReaderObjdumpPrepass *this_local;
  char *pcStack_30;
  Type type_local;
  string_view field_name_local;
  string_view module_name_local;
  
  pcStack_30 = field_name.data_;
  module_name_local.data_ = (char *)module_name.size_;
  this_local._4_4_ = type.enum_;
  local_45 = mutable_;
  local_44 = import_index;
  pBStack_40 = this;
  string_view::to_string_abi_cxx11_(local_b8);
  std::operator+(local_98,(char *)local_b8);
  string_view::to_string_abi_cxx11_(local_d8);
  std::operator+(local_78,local_98);
  string_view::string_view(&local_58,local_78);
  SetGlobalName(this,global_index,local_58);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)local_d8);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_b8);
  Result::Result((Result *)((long)&module_name_local.size_ + 4),Ok);
  return (Result)module_name_local.size_._4_4_;
}

Assistant:

Result OnImportGlobal(Index import_index,
                        string_view module_name,
                        string_view field_name,
                        Index global_index,
                        Type type,
                        bool mutable_) override {
    SetGlobalName(global_index,
                  module_name.to_string() + "." + field_name.to_string());
    return Result::Ok;
  }